

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O0

string_type * __thiscall
booster::locale::impl_icu::converter_impl<wchar_t>::convert_abi_cxx11_
          (converter_impl<wchar_t> *this,conversion_type how,char_type_conflict *begin,
          char_type_conflict *end,int flags)

{
  undefined4 in_EDX;
  long in_RSI;
  string_type *in_RDI;
  UnicodeString str;
  icu_std_converter<wchar_t,_4> cvt;
  string *this_00;
  char_type_conflict *in_stack_ffffffffffffff60;
  icu_std_converter<wchar_t,_4> *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff9c;
  UnicodeString *in_stack_ffffffffffffffa0;
  icu_std_converter<wchar_t,_4> *in_stack_ffffffffffffffa8;
  string local_50;
  icu_std_converter<wchar_t,_4> local_30 [7];
  undefined4 local_14;
  
  this_00 = &local_50;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)this_00,(string *)(in_RSI + 0xf0));
  icu_std_converter<wchar_t,_4>::icu_std_converter(local_30,this_00,cvt_skip);
  std::__cxx11::string::~string((string *)&local_50);
  icu_std_converter<wchar_t,_4>::icu
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(char_type_conflict *)this_00);
  switch(local_14) {
  case 0:
    anon_unknown_12::normalize_string(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    break;
  case 1:
    icu_70::UnicodeString::toUpper((Locale *)&stack0xffffffffffffff60);
    break;
  case 2:
    icu_70::UnicodeString::toLower((Locale *)&stack0xffffffffffffff60);
    break;
  case 3:
    icu_70::UnicodeString::foldCase((uint)&stack0xffffffffffffff60);
    break;
  case 4:
    icu_70::UnicodeString::toTitle((BreakIterator *)&stack0xffffffffffffff60,(Locale *)0x0);
  }
  icu_std_converter<wchar_t,4>::std_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&stack0xffffffffffffff60);
  return in_RDI;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int flags = 0) const
        {
            icu_std_converter<char_type> cvt(encoding_);
            icu::UnicodeString str=cvt.icu(begin,end);
            switch(how) {
            case converter_base::normalization:
                normalize_string(str,flags);
                break;
            case converter_base::upper_case:
                str.toUpper(locale_);
                break;
            case converter_base::lower_case:
                str.toLower(locale_);
                break;
            case converter_base::title_case:
                str.toTitle(0,locale_);
                break;
            case converter_base::case_folding:
                str.foldCase();
                break;
            default:
                ;
            }
            return cvt.std(str);
        }